

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O1

bool __thiscall QDataWidgetMapperPrivate::commit(QDataWidgetMapperPrivate *this,WidgetMapper *m)

{
  Data *pDVar1;
  QAbstractItemModel *pQVar2;
  char cVar3;
  bool bVar4;
  QObject *pQVar5;
  long in_FS_OFFSET;
  QModelIndex local_68;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (m->widget).wp.d;
  bVar4 = true;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     ((m->widget).wp.value != (QObject *)0x0)) {
    cVar3 = QPersistentModelIndex::isValid();
    if (cVar3 == '\0') {
      bVar4 = false;
    }
    else {
      local_68.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_68,&m->currentIndex);
      if ((m->property).d.size == 0) {
        pDVar1 = (m->widget).wp.d;
        if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
          pQVar5 = (QObject *)0x0;
        }
        else {
          pQVar5 = (m->widget).wp.value;
        }
        (**(code **)(*(long *)this->delegate + 0x88))(this->delegate,pQVar5,this->model,&local_68);
      }
      else {
        pQVar2 = this->model;
        QObject::property((char *)&local_48);
        (**(code **)(*(long *)pQVar2 + 0x98))(pQVar2,&local_68,&local_48,2);
        ::QVariant::~QVariant(&local_48);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QDataWidgetMapperPrivate::commit(const WidgetMapper &m)
{
    if (m.widget.isNull())
        return true; // just ignore

    if (!m.currentIndex.isValid())
        return false;

    // Create copy to avoid passing the widget mappers data
    QModelIndex idx = m.currentIndex;
    if (m.property.isEmpty())
        delegate->setModelData(m.widget, model, idx);
    else
        model->setData(idx, m.widget->property(m.property), Qt::EditRole);

    return true;
}